

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O0

void r3d::ClipHelper<2>::finalize_links(Int onv,Polytope<2> *poly)

{
  int local_20;
  int local_1c;
  Int vcur;
  Int vstart;
  Polytope<2> *poly_local;
  Int onv_local;
  
  for (local_1c = onv; local_1c < poly->nverts; local_1c = local_1c + 1) {
    if (poly->verts[local_1c].pnbrs[1] < 0) {
      local_20 = poly->verts[local_1c].pnbrs[0];
      do {
        local_20 = poly->verts[local_20].pnbrs[0];
      } while (local_20 < onv);
      poly->verts[local_1c].pnbrs[1] = local_20;
      poly->verts[local_20].pnbrs[0] = local_1c;
    }
  }
  return;
}

Assistant:

R3D_INLINE static void finalize_links(Int onv, Polytope<2>& poly) {
    for (auto vstart = onv; vstart < poly.nverts; ++vstart) {
      if (poly.verts[vstart].pnbrs[1] >= 0) continue;
      auto vcur = poly.verts[vstart].pnbrs[0];
      do {
        vcur = poly.verts[vcur].pnbrs[0];
      } while (vcur < onv);
      poly.verts[vstart].pnbrs[1] = vcur;
      poly.verts[vcur].pnbrs[0] = vstart;
    }
  }